

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeM
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  Scalar SVar5;
  Scalar SVar6;
  Scalar SVar7;
  Scalar SVar8;
  rotation_t R;
  double *local_b8 [2];
  rotation_t *local_a8;
  double *local_a0;
  undefined8 uStack_98;
  rotation_t *local_90;
  Matrix3d *local_88;
  double *pdStack_80;
  undefined8 local_78;
  rotation_t *local_70;
  Matrix3d *local_68;
  double *pdStack_60;
  undefined8 local_58;
  rotation_t *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  math::cayley2rot_reduced(cayley);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_a0 = (double *)0x2;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x2;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = yyF;
  pdStack_80 = pdVar1;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_a8 = (rotation_t *)0xc000000000000000;
  local_88 = (Matrix3d *)0x2;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 1;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = pdVar1;
  local_90 = &R;
  local_68 = yzF;
  pdStack_60 = pdVar2;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x1;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x1;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar2;
  local_a8 = &R;
  local_88 = zzF;
  pdStack_80 = pdVar2;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = SVar7 + SVar6 + SVar5;
  local_a0 = (double *)0x2;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = yzF;
  pdStack_80 = (double *)&R;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             2;
  local_a8 = (rotation_t *)0xbff0000000000000;
  local_88 = (Matrix3d *)0x2;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 2;
  uStack_40 = 0;
  local_38 = 1;
  local_90 = &R;
  local_68 = xyF;
  pdStack_60 = local_a0;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_88 = (Matrix3d *)0x1;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = pdVar1;
  local_90 = &R;
  local_68 = zzF;
  pdStack_60 = (double *)&R;
  local_50 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x1;
  uStack_98 = 0;
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_90 = (rotation_t *)0x1;
  local_88 = zxF;
  local_68 = (Matrix3d *)0x2;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  pdStack_80 = pdVar2;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  pdStack_80 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 1;
  local_a0 = (double *)0x2;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x1;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = SVar7 + SVar8 + SVar6 + SVar5;
  local_b8[0] = pdVar2;
  local_a8 = &R;
  local_88 = xyF;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xbff0000000000000;
  local_88 = (Matrix3d *)0x2;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = pdVar2;
  local_90 = &R;
  local_68 = yyF;
  pdStack_60 = (double *)&R;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_88 = (Matrix3d *)0x1;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_68 = zxF;
  local_48 = 1;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = pdVar1;
  local_90 = &R;
  pdStack_60 = pdVar1;
  local_50 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x1;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = yzF;
  pdStack_80 = (double *)&R;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = SVar7 + SVar8 + SVar6 + SVar5;
  local_a0 = (double *)0x0;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = (double *)&R;
  local_a8 = &R;
  local_88 = zzF;
  pdStack_80 = (double *)&R;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_a8 = (rotation_t *)0xc000000000000000;
  local_88 = (Matrix3d *)0x0;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_68 = zxF;
  local_48 = 2;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = (double *)&R;
  local_90 = &R;
  pdStack_60 = pdVar1;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x2;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x2;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = xxF;
  pdStack_80 = pdVar1;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  pdStack_80 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = SVar7 + SVar6 + SVar5;
  local_a0 = (double *)0x0;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_88 = zxF;
  local_68 = (Matrix3d *)0x1;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = (double *)&R;
  local_a8 = &R;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xbff0000000000000;
  local_88 = (Matrix3d *)0x0;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = (double *)&R;
  local_90 = &R;
  local_68 = yzF;
  pdStack_60 = (double *)&R;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  pdStack_60 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 1;
  local_88 = (Matrix3d *)0x2;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 1;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = pdVar1;
  local_90 = &R;
  local_68 = xxF;
  local_50 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x2;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = xyF;
  pdStack_80 = (double *)&R;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  dVar4 = SVar7 + SVar8 + SVar6 + SVar5;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_a0 = (double *)0x1;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x1;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar4;
  local_b8[0] = pdVar1;
  local_a8 = &R;
  local_88 = xxF;
  pdStack_80 = pdVar1;
  local_70 = &R;
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a8 = (rotation_t *)0xc000000000000000;
  local_88 = (Matrix3d *)0x0;
  pdStack_80 = (double *)0x0;
  local_78 = 1;
  local_48 = 1;
  uStack_40 = 0;
  local_38 = 1;
  local_a0 = (double *)&R;
  local_90 = &R;
  local_68 = xyF;
  pdStack_60 = pdVar1;
  local_50 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  local_a0 = (double *)0x0;
  uStack_98 = 0;
  local_90 = (rotation_t *)0x1;
  local_68 = (Matrix3d *)0x0;
  pdStack_60 = (double *)0x0;
  local_58 = 1;
  local_b8[0] = (double *)&R;
  local_a8 = &R;
  local_88 = yyF;
  pdStack_80 = (double *)&R;
  local_70 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_b8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = SVar7 + SVar6 + SVar5;
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeM(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const cayley_t & cayley)
{
  Eigen::Matrix3d M;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //Fill the matrix M using the precomputed summation terms
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);

  return M;
}